

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEditPrivate::updateEditFieldGeometry(QDateTimeEditPrivate *this)

{
  long lVar1;
  QWidget *widget;
  QWidget *this_00;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QRect local_c0;
  QStyleOptionComboBox optCombo;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->calendarPopup == true) &&
     (((this->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
       super_QFlagsStorage<QDateTimeEdit::Section>.i & 0x3f00) != 0)) {
    widget = *(QWidget **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
    memset(&optCombo,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&optCombo);
    QStyleOption::initFrom((QStyleOption *)&optCombo,widget);
    optCombo.editable = true;
    optCombo.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
    super_QFlagsStorage<QStyle::SubControl>.i =
         (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0x2;
    this_00 = &((this->super_QAbstractSpinBoxPrivate).edit)->super_QWidget;
    pQVar2 = QWidget::style(widget);
    local_c0 = (QRect)(**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,1,&optCombo,2,widget);
    QWidget::setGeometry(this_00,&local_c0);
    QStyleOptionComboBox::~QStyleOptionComboBox(&optCombo);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QAbstractSpinBoxPrivate::updateEditFieldGeometry(&this->super_QAbstractSpinBoxPrivate);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateEditFieldGeometry()
{
    if (!calendarPopupEnabled()) {
        QAbstractSpinBoxPrivate::updateEditFieldGeometry();
        return;
    }

    Q_Q(QDateTimeEdit);

    QStyleOptionComboBox optCombo;
    optCombo.initFrom(q);
    optCombo.editable = true;
    optCombo.subControls = QStyle::SC_ComboBoxEditField;
    edit->setGeometry(q->style()->subControlRect(QStyle::CC_ComboBox, &optCombo,
                                                 QStyle::SC_ComboBoxEditField, q));
}